

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O3

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,_1,false>,Eigen::internal::assign_op<float,float>>
               (Matrix<float,__1,__1,_0,__1,__1> *dst,
               Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false> *src,
               assign_op<float,_float> *func)

{
  ulong rows;
  long lVar1;
  ulong cols;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  ulong uVar4;
  float *pfVar5;
  undefined8 *puVar6;
  ulong uVar7;
  ulong uVar8;
  Index row;
  ulong uVar9;
  long lVar10;
  Index row_1;
  ulong uVar11;
  PointerType pfVar12;
  
  pfVar12 = (src->
            super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
            ).
            super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
            .
            super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
            .m_data;
  rows = (src->
         super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
         ).super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
         .
         super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
         .m_rows.m_value;
  lVar1 = (((src->
            super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
            ).
            super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
           .m_xpr)->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.
          m_rows;
  cols = (src->
         super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
         ).super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
         .
         super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
         .m_cols.m_value;
  if (((dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_rows !=
       rows) ||
     (uVar4 = cols, uVar7 = rows,
     (dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_cols != cols
     )) {
    if ((long)(cols | rows) < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/PlainObjectBase.h"
                    ,0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<float, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<float, -1, -1>]"
                   );
    }
    if ((cols != 0 && rows != 0) &&
       (auVar2 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
       SUB168(auVar2 / SEXT816((long)cols),0) < (long)rows)) {
      puVar6 = (undefined8 *)__cxa_allocate_exception(8,src,SUB168(auVar2 % SEXT816((long)cols),0));
      *puVar6 = boost::program_options::detail::cmdline::cmdline;
      __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    DenseStorage<float,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<float,__1,__1,__1,_0> *)dst,cols * rows,rows,cols);
    uVar7 = (dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
    uVar4 = (dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  }
  if ((uVar7 == rows) && (uVar4 == cols)) {
    if (0 < (long)cols) {
      pfVar5 = (dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.
               m_data;
      uVar4 = (ulong)(-(int)rows & 3);
      uVar7 = 0;
      uVar8 = 0;
      do {
        if (0 < (long)uVar7) {
          uVar9 = 0;
          do {
            pfVar5[uVar9] = pfVar12[uVar9];
            uVar9 = uVar9 + 1;
          } while (uVar7 != uVar9);
        }
        uVar11 = rows - uVar7 & 0xfffffffffffffffc;
        lVar10 = uVar11 + uVar7;
        uVar9 = uVar7;
        if (0 < (long)uVar11) {
          do {
            uVar3 = *(undefined8 *)(pfVar12 + uVar9 + 2);
            *(undefined8 *)(pfVar5 + uVar9) = *(undefined8 *)(pfVar12 + uVar9);
            *(undefined8 *)(pfVar5 + uVar9 + 2) = uVar3;
            uVar9 = uVar9 + 4;
          } while ((long)uVar9 < lVar10);
        }
        for (; lVar10 < (long)rows; lVar10 = lVar10 + 1) {
          pfVar5[lVar10] = pfVar12[lVar10];
        }
        uVar9 = uVar7 + uVar4;
        uVar7 = uVar7 + uVar4 + 3;
        if (-1 < (long)uVar9) {
          uVar7 = uVar9;
        }
        uVar7 = uVar9 - (uVar7 & 0xfffffffffffffffc);
        if ((long)rows < (long)uVar7) {
          uVar7 = rows;
        }
        uVar8 = uVar8 + 1;
        pfVar12 = pfVar12 + lVar1;
        pfVar5 = pfVar5 + rows;
      } while (uVar8 != cols);
    }
    return;
  }
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/AssignEvaluator.h"
                ,0x2fd,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<float, -1, -1>, SrcXprType = Eigen::Block<const Eigen::Matrix<float, -1, -1>>, T1 = float, T2 = float]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}